

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureHelper::qt_TextureStorage2DMultisample
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,
          GLsizei samples,GLenum internalFormat,GLsizei width,GLsizei height,
          GLboolean fixedSampleLocations)

{
  QOpenGLFunctions *in_RDI;
  GLboolean in_R8B;
  long in_FS_OFFSET;
  TextureBinder binder;
  GLenum in_stack_ffffffffffffffac;
  GLenum in_stack_ffffffffffffffb0;
  GLenum in_stack_ffffffffffffffb4;
  QOpenGLTextureHelper *this_00;
  QOpenGLFunctions *local_18;
  TextureParameteriMemberFunc TStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QOpenGLFunctions *)0xaaaaaaaaaaaaaaaa;
  TStack_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = (QOpenGLTextureHelper *)&stack0xffffffffffffffe8;
  anon_unknown.dwarf_18e721::TextureBinder::TextureBinder
            ((TextureBinder *)this_00,in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac);
  glTexStorage2DMultisample
            (this_00,(GLenum)((ulong)in_RDI >> 0x20),(GLsizei)in_RDI,in_stack_ffffffffffffffb4,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_R8B);
  anon_unknown.dwarf_18e721::TextureBinder::~TextureBinder((TextureBinder *)0x1a7b18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureStorage2DMultisample(GLuint texture, GLenum target, GLenum bindingTarget, GLsizei samples, GLenum internalFormat, GLsizei width, GLsizei height, GLboolean fixedSampleLocations)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glTexStorage2DMultisample(target, samples, internalFormat, width, height, fixedSampleLocations);
}